

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rdecomp_short(uchar *c,int clen,unsigned_short *array,int nx,int nblock)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int bbits;
  int fsbits;
  int fsmax;
  uint lastpix;
  uint diff;
  uint b;
  uchar bytevalue;
  uchar *cend;
  int fs;
  int nzero;
  int nbits;
  int k;
  int imax;
  int i;
  int nblock_local;
  int nx_local;
  unsigned_short *array_local;
  byte *pbStack_18;
  int clen_local;
  uchar *c_local;
  
  fsbits = (int)CONCAT11(*c,c[1]);
  pbVar5 = c + 2;
  pbStack_18 = c + 3;
  lastpix = (uint)*pbVar5;
  fs = 8;
  k = 0;
  do {
    if (nx <= k) {
      if (pbStack_18 < pbVar5 + (long)clen + -2) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
      }
      return 0;
    }
    for (fs = fs + -4; fs < 0; fs = fs + 8) {
      lastpix = lastpix << 8 | (uint)*pbStack_18;
      pbStack_18 = pbStack_18 + 1;
    }
    bVar6 = (byte)fs;
    iVar1 = (lastpix >> (bVar6 & 0x1f)) - 1;
    lastpix = (1 << (bVar6 & 0x1f)) - 1U & lastpix;
    nbits = k + nblock;
    if (nx < nbits) {
      nbits = nx;
    }
    if (iVar1 < 0) {
      for (; k < nbits; k = k + 1) {
        array[k] = (unsigned_short)fsbits;
      }
    }
    else if (iVar1 == 0xe) {
      for (; k < nbits; k = k + 1) {
        nzero = 0x10 - fs;
        fsmax = lastpix << ((byte)nzero & 0x1f);
        while( true ) {
          nzero = nzero + -8;
          if (nzero < 0) break;
          fsmax = (uint)*pbStack_18 << ((byte)nzero & 0x1f) | fsmax;
          pbStack_18 = pbStack_18 + 1;
        }
        if (fs < 1) {
          lastpix = 0;
        }
        else {
          fsmax = (uint)(*pbStack_18 >> (-(byte)nzero & 0x1f)) | fsmax;
          lastpix = (1 << (bVar6 & 0x1f)) - 1U & (uint)*pbStack_18;
          pbStack_18 = pbStack_18 + 1;
        }
        if ((fsmax & 1U) == 0) {
          fsmax._0_2_ = (ushort)((uint)fsmax >> 1);
        }
        else {
          fsmax._0_2_ = (ushort)((uint)fsmax >> 1) ^ 0xffff;
        }
        array[k] = (ushort)fsmax + (short)fsbits;
        fsbits = (int)array[k];
      }
    }
    else {
      for (; k < nbits; k = k + 1) {
        while (lastpix == 0) {
          fs = fs + 8;
          lastpix = (uint)*pbStack_18;
          pbStack_18 = pbStack_18 + 1;
        }
        iVar2 = fs - nonzero_count[lastpix];
        iVar3 = fs - (iVar2 + 1);
        lastpix = 1 << ((byte)iVar3 & 0x1f) ^ lastpix;
        for (fs = iVar3 - iVar1; fs < 0; fs = fs + 8) {
          lastpix = lastpix << 8 | (uint)*pbStack_18;
          pbStack_18 = pbStack_18 + 1;
        }
        uVar4 = iVar2 << ((byte)iVar1 & 0x1f) | lastpix >> ((byte)fs & 0x1f);
        lastpix = (1 << ((byte)fs & 0x1f)) - 1U & lastpix;
        if ((uVar4 & 1) == 0) {
          fsmax._0_2_ = (ushort)(uVar4 >> 1);
        }
        else {
          fsmax._0_2_ = (ushort)(uVar4 >> 1) ^ 0xffff;
        }
        array[k] = (ushort)fsmax + (short)fsbits;
        fsbits = (int)array[k];
      }
    }
  } while (pbStack_18 <= pbVar5 + (long)clen + -2);
  ffpmsg("decompression error: hit end of compressed byte stream");
  return 1;
}

Assistant:

int fits_rdecomp_short (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned short array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 2; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 4;
    fsmax = 14;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 2 bytes of input buffer contain the value of the first */
    /* 2 byte integer value, without any encoding */
    
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[1];
    lastpix = lastpix | bytevalue;

    c += 2;  
    cend = c + clen - 2;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}